

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::TestBody(HashtableAllTest_ResizeAndRehash_Test<google::HashtableInterface_SparseHashSet<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  const_iterator cVar1;
  int i;
  int iVar2;
  pointer ppcVar3;
  float fVar4;
  float fVar5;
  float fVar6;
  pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  r;
  TypeParam ht;
  Hasher local_138;
  Hasher local_128;
  SetKey local_11a;
  Identity local_119;
  pair<google::sparse_hashtable_const_iterator<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_bool>
  local_118;
  undefined **local_c8;
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  local_c0;
  
  local_138._0_8_ = (char *)0x0;
  local_138.num_compares_ = 0;
  local_128.id_ = 0;
  local_128.num_hashes_ = 0;
  local_128.num_compares_ = 0;
  local_118.first.ht._0_4_ = 0;
  local_118.first.pos.row_begin._M_current =
       (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
        *)0x0;
  local_c8 = &PTR__BaseHashtableInterface_00c25f28;
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::sparse_hashtable(&local_c0,10000,&local_138,&local_128,&local_119,&local_11a,
                     (Alloc<const_char_*,_unsigned_long,_18446744073709551615UL> *)&local_118);
  local_c8 = &PTR__BaseHashtableInterface_00c25ea8;
  fVar4 = 0.4;
  if (local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
      shrink_factor_ <= 0.4) {
    fVar4 = local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
            shrink_factor_;
  }
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_factor_ = 0.8;
  fVar5 = fVar4 * (float)local_c0.table.settings.table_size;
  fVar6 = (float)local_c0.table.settings.table_size * 0.8;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ = (size_type)fVar6;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  enlarge_threshold_ =
       (long)(fVar6 - 9.223372e+18) &
       (long)local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             enlarge_threshold_ >> 0x3f |
       local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
       enlarge_threshold_;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ = (size_type)fVar5;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_threshold_ =
       (long)(fVar5 - 9.223372e+18) &
       (long)local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
             shrink_threshold_ >> 0x3f |
       local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
       shrink_threshold_;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  consider_shrink_ = false;
  iVar2 = 1;
  local_c0.settings.super_sh_hashtable_settings<const_char_*,_Hasher,_unsigned_long,_4>.
  shrink_factor_ = fVar4;
  do {
    local_138._0_8_ = UniqueObjectHelper<char_const*>(iVar2);
    google::
    sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert(&local_118,
             (sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_c0,(value_type *)&local_138);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 100);
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_c0,0);
  local_138.id_ = (undefined4)local_c0.table.settings.table_size;
  local_138.num_hashes_ = local_c0.table.settings.table_size._4_4_;
  local_128.id_ = 300;
  testing::internal::CmpHelperLT<unsigned_long,unsigned_int>
            ((internal *)&local_118,"ht.bucket_count()","300u",(unsigned_long *)&local_138,
             (uint *)&local_128);
  if ((char)local_118.first.ht == '\0') {
    testing::Message::Message((Message *)&local_138);
    if (local_118.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar3 = (pointer)0xafc493;
    }
    else {
      ppcVar3 = (local_118.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x29f,(char *)ppcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_138._0_8_ + 8))();
    }
  }
  cVar1._M_current = local_118.first.pos.row_begin._M_current;
  if (local_118.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_118.first.pos.row_begin._M_current)->group !=
        &((local_118.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_118.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar1._M_current);
  }
  google::
  sparse_hashtable<const_char_*,_const_char_*,_Hasher,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::Identity,_google::sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>::SetKey,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
  ::resize(&local_c0,9000);
  local_128.id_ = 0x4000;
  local_138.id_ = (undefined4)local_c0.table.settings.table_size;
  local_138.num_hashes_ = local_c0.table.settings.table_size._4_4_;
  testing::internal::CmpHelperEQ<unsigned_int,unsigned_long>
            ((internal *)&local_118,"16384u","ht.bucket_count()",(uint *)&local_128,
             (unsigned_long *)&local_138);
  if ((char)local_118.first.ht == '\0') {
    testing::Message::Message((Message *)&local_138);
    if (local_118.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar3 = (pointer)0xafc493;
    }
    else {
      ppcVar3 = (local_118.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2a3,(char *)ppcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_138._0_8_ + 8))();
    }
  }
  cVar1._M_current = local_118.first.pos.row_begin._M_current;
  if (local_118.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_118.first.pos.row_begin._M_current)->group !=
        &((local_118.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_118.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar1._M_current);
  }
  iVar2 = 0x65;
  do {
    local_138._0_8_ = UniqueObjectHelper<char_const*>(iVar2);
    google::
    sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
    ::insert(&local_118,
             (sparse_hash_set<const_char_*,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
              *)&local_c0,(value_type *)&local_138);
    iVar2 = iVar2 + 1;
  } while (iVar2 != 200);
  local_138.id_ = (undefined4)local_c0.table.settings.table_size;
  local_138.num_hashes_ = local_c0.table.settings.table_size._4_4_;
  local_128.id_ = 0x4000;
  testing::internal::CmpHelperEQ<unsigned_long,unsigned_int>
            ((internal *)&local_118,"ht.bucket_count()","16384u",(unsigned_long *)&local_138,
             (uint *)&local_128);
  if ((char)local_118.first.ht == '\0') {
    testing::Message::Message((Message *)&local_138);
    if (local_118.first.pos.row_begin._M_current ==
        (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
         *)0x0) {
      ppcVar3 = (pointer)0xafc493;
    }
    else {
      ppcVar3 = (local_118.first.pos.row_begin._M_current)->group;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_128,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/sparsehash[P]sparsehash-c11/tests/hashtable_unittests.cc"
               ,0x2a6,(char *)ppcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_128,(Message *)&local_138);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_128);
    if ((long *)local_138._0_8_ != (long *)0x0) {
      (**(code **)(*(long *)local_138._0_8_ + 8))();
    }
  }
  cVar1._M_current = local_118.first.pos.row_begin._M_current;
  if (local_118.first.pos.row_begin._M_current !=
      (sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>
       *)0x0) {
    if ((int **)(local_118.first.pos.row_begin._M_current)->group !=
        &((local_118.first.pos.row_begin._M_current)->settings).
         super_alloc_impl<Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>.
         super_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>.count_) {
      operator_delete((local_118.first.pos.row_begin._M_current)->group);
    }
    operator_delete(cVar1._M_current);
  }
  local_c8 = &PTR__BaseHashtableInterface_00c25f28;
  std::
  vector<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<const_char_*,_(unsigned_short)48,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&local_c0.table.groups);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ResizeAndRehash) {
  // resize() and rehash() are synonyms.  rehash() is the tr1 name.
  TypeParam ht(10000);
  ht.max_load_factor(0.8f);  // for consistency's sake

  for (int i = 1; i < 100; ++i) ht.insert(this->UniqueObject(i));
  ht.resize(0);
  // Now ht should be as small as possible.
  EXPECT_LT(ht.bucket_count(), 300u);

  ht.rehash(9000);  // use the 'rehash' version of the name.
  // Bucket count should be next power of 2, after considering max_load_factor.
  EXPECT_EQ(16384u, ht.bucket_count());
  for (int i = 101; i < 200; ++i) ht.insert(this->UniqueObject(i));
  // Adding a few hundred buckets shouldn't have caused a resize yet.
  EXPECT_EQ(ht.bucket_count(), 16384u);
}